

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall SleighSymbol::restoreXmlHeader(SleighSymbol *this,Element *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  string *psVar3;
  istringstream s;
  string local_1b8;
  string local_198 [3];
  ios_base local_120 [264];
  
  local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"name","");
  Element::getAttributeValue(el,local_198);
  std::__cxx11::string::_M_assign((string *)&this->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p);
  }
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"id","");
  psVar3 = Element::getAttributeValue(el,&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)psVar3,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  puVar2 = (uint *)((long)&local_198[0].field_2 +
                   *(long *)(local_198[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar2 = *puVar2 & 0xffffffb5;
  std::istream::_M_extract<unsigned_int>((uint *)local_198);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
  std::ios_base::~ios_base(local_120);
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"scope","");
  psVar3 = Element::getAttributeValue(el,&local_1b8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)psVar3,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  puVar2 = (uint *)((long)&local_198[0].field_2 +
                   *(long *)(local_198[0]._M_dataplus._M_p + -0x18) + 8);
  *puVar2 = *puVar2 & 0xffffffb5;
  std::istream::_M_extract<unsigned_int>((uint *)local_198);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void SleighSymbol::restoreXmlHeader(const Element *el)

{
  name = el->getAttributeValue("name");
  {
    istringstream s(el->getAttributeValue("id"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> id;
  }
  {
    istringstream s(el->getAttributeValue("scope"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> scopeid;
  }
}